

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_got_pkt_from_server(ssh_sharing_connstate *cs,int type,void *vpkt,int pktlen)

{
  share_globreq *ptr;
  uint32_t server_id_00;
  unsigned_long uVar1;
  share_channel *chan_00;
  void *__dest;
  share_xchannel *xc_00;
  ptrlen data;
  uchar *rewritten;
  undefined1 local_88 [8];
  BinarySource src [1];
  share_xchannel *xc;
  share_channel *chan;
  uint server_id;
  uint upstream_id;
  size_t id_pos;
  share_globreq *globreq;
  uchar *pkt;
  int pktlen_local;
  void *vpkt_local;
  int type_local;
  ssh_sharing_connstate *cs_local;
  
  data = make_ptrlen(vpkt,(long)pktlen);
  BinarySource_INIT__((BinarySource *)local_88,data);
  if (type - 0x51U < 2) {
    ptr = cs->globreq_head;
    if (ptr == (share_globreq *)0x0) {
      __assert_fail("globreq",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x49c,
                    "void share_got_pkt_from_server(ssh_sharing_connstate *, int, const void *, int)"
                   );
    }
    if (ptr->type == 0) {
      if (type == 0x52) {
        share_remove_forwarding(cs,ptr->fwd);
      }
      else {
        ptr->fwd->active = true;
      }
    }
    else if ((ptr->type == 1) && (type == 0x51)) {
      share_remove_forwarding(cs,ptr->fwd);
    }
    if ((ptr->want_reply & 1U) != 0) {
      send_packet_to_downstream(cs,type,vpkt,pktlen,(share_channel *)0x0);
    }
    cs->globreq_head = ptr->next;
    safefree(ptr);
    if (cs->globreq_head == (share_globreq *)0x0) {
      cs->globreq_tail = (share_globreq *)0x0;
    }
    if (cs->sock == (Socket *)0x0) {
      share_try_cleanup(cs);
    }
  }
  else if (type == 0x5a) {
    BinarySource_get_string((BinarySource *)src[0]._24_8_);
    uVar1 = BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
    if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
      __assert_fail("!get_err(src)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x4bb,
                    "void share_got_pkt_from_server(ssh_sharing_connstate *, int, const void *, int)"
                   );
    }
    share_add_halfchannel(cs,(uint)uVar1);
    send_packet_to_downstream(cs,0x5a,vpkt,pktlen,(share_channel *)0x0);
  }
  else {
    if (9 < type - 0x5bU) {
      __assert_fail("false && \"This packet type should never have come from \" \"connection2.c\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x50d,
                    "void share_got_pkt_from_server(ssh_sharing_connstate *, int, const void *, int)"
                   );
    }
    uVar1 = BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
    chan_00 = share_find_channel_by_upstream(cs,(uint)uVar1);
    if (chan_00 == (share_channel *)0x0) {
      xc_00 = share_find_xchannel_by_upstream(cs,(uint)uVar1);
      if ((xc_00 != (share_xchannel *)0x0) &&
         (share_xchannel_add_message(xc_00,type,vpkt,pktlen), (xc_00->live & 1U) == 0)) {
        share_dead_xchannel_respond(cs,xc_00);
      }
    }
    else {
      __dest = safemalloc((long)pktlen,1,0);
      memcpy(__dest,vpkt,(long)pktlen);
      PUT_32BIT_MSB_FIRST((void *)((long)__dest + (long)src[0].data),chan_00->downstream_id);
      send_packet_to_downstream(cs,type,__dest,pktlen,chan_00);
      safefree(__dest);
      if (type == 0x5b) {
        if ((chan_00->state == 3) && (7 < pktlen)) {
          server_id_00 = GET_32BIT_MSB_FIRST((void *)((long)vpkt + 4));
          share_channel_set_server_id(cs,chan_00,server_id_00,0);
          if (cs->sock == (Socket *)0x0) {
            share_try_cleanup(cs);
          }
        }
      }
      else if (type == 0x5c) {
        ssh_delete_sharing_channel(cs->parent->cl,chan_00->upstream_id);
        share_remove_channel(cs,chan_00);
      }
      else if (type == 0x61) {
        if (chan_00->state == 1) {
          ssh_delete_sharing_channel(cs->parent->cl,chan_00->upstream_id);
          share_remove_channel(cs,chan_00);
          if (cs->sock == (Socket *)0x0) {
            share_try_cleanup(cs);
          }
        }
        else {
          chan_00->state = 2;
        }
      }
    }
  }
  return;
}

Assistant:

void share_got_pkt_from_server(ssh_sharing_connstate *cs, int type,
                               const void *vpkt, int pktlen)
{
    const unsigned char *pkt = (const unsigned char *)vpkt;
    struct share_globreq *globreq;
    size_t id_pos;
    unsigned upstream_id, server_id;
    struct share_channel *chan;
    struct share_xchannel *xc;
    BinarySource src[1];

    BinarySource_BARE_INIT(src, pkt, pktlen);

    switch (type) {
      case SSH2_MSG_REQUEST_SUCCESS:
      case SSH2_MSG_REQUEST_FAILURE:
        globreq = cs->globreq_head;
        assert(globreq);         /* should match the queue in connection2.c */
        if (globreq->type == GLOBREQ_TCPIP_FORWARD) {
            if (type == SSH2_MSG_REQUEST_FAILURE) {
                share_remove_forwarding(cs, globreq->fwd);
            } else {
                globreq->fwd->active = true;
            }
        } else if (globreq->type == GLOBREQ_CANCEL_TCPIP_FORWARD) {
            if (type == SSH2_MSG_REQUEST_SUCCESS) {
                share_remove_forwarding(cs, globreq->fwd);
            }
        }
        if (globreq->want_reply) {
            send_packet_to_downstream(cs, type, pkt, pktlen, NULL);
        }
        cs->globreq_head = globreq->next;
        sfree(globreq);
        if (cs->globreq_head == NULL)
            cs->globreq_tail = NULL;

        if (!cs->sock) {
            /* Retry cleaning up this connection, in case that reply
             * was the last thing we were waiting for. */
            share_try_cleanup(cs);
        }

        break;

      case SSH2_MSG_CHANNEL_OPEN:
        get_string(src);
        server_id = get_uint32(src);
        assert(!get_err(src));
        share_add_halfchannel(cs, server_id);

        send_packet_to_downstream(cs, type, pkt, pktlen, NULL);
        break;

      case SSH2_MSG_CHANNEL_OPEN_CONFIRMATION:
      case SSH2_MSG_CHANNEL_OPEN_FAILURE:
      case SSH2_MSG_CHANNEL_CLOSE:
      case SSH2_MSG_CHANNEL_WINDOW_ADJUST:
      case SSH2_MSG_CHANNEL_DATA:
      case SSH2_MSG_CHANNEL_EXTENDED_DATA:
      case SSH2_MSG_CHANNEL_EOF:
      case SSH2_MSG_CHANNEL_REQUEST:
      case SSH2_MSG_CHANNEL_SUCCESS:
      case SSH2_MSG_CHANNEL_FAILURE:
        /*
         * All these messages have the recipient channel id as the
         * first uint32 field in the packet. Substitute the downstream
         * channel id for our one and pass the packet downstream.
         */
        id_pos = src->pos;
        upstream_id = get_uint32(src);
        if ((chan = share_find_channel_by_upstream(cs, upstream_id)) != NULL) {
            /*
             * The normal case: this id refers to an open channel.
             */
            unsigned char *rewritten = snewn(pktlen, unsigned char);
            memcpy(rewritten, pkt, pktlen);
            PUT_32BIT_MSB_FIRST(rewritten + id_pos, chan->downstream_id);
            send_packet_to_downstream(cs, type, rewritten, pktlen, chan);
            sfree(rewritten);

            /*
             * Update the channel state, for messages that need it.
             */
            if (type == SSH2_MSG_CHANNEL_OPEN_CONFIRMATION) {
                if (chan->state == UNACKNOWLEDGED && pktlen >= 8) {
                    share_channel_set_server_id(
                        cs, chan, GET_32BIT_MSB_FIRST(pkt+4), OPEN);
                    if (!cs->sock) {
                        /* Retry cleaning up this connection, so that we
                         * can send an immediate CLOSE on this channel for
                         * which we now know the server id. */
                        share_try_cleanup(cs);
                    }
                }
            } else if (type == SSH2_MSG_CHANNEL_OPEN_FAILURE) {
                ssh_delete_sharing_channel(cs->parent->cl, chan->upstream_id);
                share_remove_channel(cs, chan);
            } else if (type == SSH2_MSG_CHANNEL_CLOSE) {
                if (chan->state == SENT_CLOSE) {
                    ssh_delete_sharing_channel(cs->parent->cl,
                                               chan->upstream_id);
                    share_remove_channel(cs, chan);
                    if (!cs->sock) {
                        /* Retry cleaning up this connection, in case this
                         * channel closure was the last thing we were
                         * waiting for. */
                        share_try_cleanup(cs);
                    }
                } else {
                    chan->state = RCVD_CLOSE;
                }
            }
        } else if ((xc = share_find_xchannel_by_upstream(cs, upstream_id))
                   != NULL) {
            /*
             * The unusual case: this id refers to an xchannel. Add it
             * to the xchannel's queue.
             */
            share_xchannel_add_message(xc, type, pkt, pktlen);

            /* If the xchannel is dead, then also respond to it (which
             * may involve deleting the channel). */
            if (!xc->live)
                share_dead_xchannel_respond(cs, xc);
        }
        break;

      default:
        unreachable("This packet type should never have come from "
                    "connection2.c");
    }
}